

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O1

Literals * __thiscall
wasm::ShellExternalInterface::callImport
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Function *import,
          Literals *arguments)

{
  char **ppcVar1;
  char *pcVar2;
  Literal LVar3;
  int iVar4;
  ModuleRunnerBase<wasm::ModuleRunner> *this_00;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  Literal *pLVar8;
  long lVar9;
  undefined1 local_1f8 [8];
  value_type argument;
  Literal local_70;
  long local_58;
  Literal *local_50;
  Literals *local_48;
  Literals *local_40;
  char local_31;
  
  pcVar2 = (import->super_Importable).module.super_IString.str._M_str;
  local_40 = arguments;
  if (((pcVar2 == _divF32x4) && (PRINT <= (import->super_Importable).base.super_IString.str._M_len))
     && ((PRINT == 0 ||
         (iVar4 = bcmp((import->super_Importable).base.super_IString.str._M_str,_extendLowUToI32x4,
                       PRINT), iVar4 == 0)))) {
    local_58 = ((long)(local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               (local_40->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
    local_48 = __return_storage_ptr__;
    if (local_58 != 0) {
      local_50 = (local_40->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
      lVar7 = -0x18;
      lVar9 = 0;
      do {
        pLVar8 = (Literal *)
                 ((long)&((local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar7);
        if (lVar9 == 0) {
          pLVar8 = local_50;
        }
        ::wasm::Literal::Literal((Literal *)local_1f8,pLVar8);
        ::wasm::Literal::Literal(&local_70,(Literal *)local_1f8);
        LVar3.type.id = (uintptr_t)argument.field_0.func.super_IString.str._M_str;
        LVar3.field_0 = _local_1f8;
        poVar5 = (ostream *)::wasm::operator<<((ostream *)&std::cout,LVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
        poVar5 = (ostream *)
                 ::wasm::operator<<(poVar5,(Type)argument.field_0.gcData.
                                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
        ::wasm::Literal::~Literal(&local_70);
        ::wasm::Literal::~Literal((Literal *)local_1f8);
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 0x18;
      } while (local_58 != lVar9);
    }
    (local_48->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 = 0;
    (local_48->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = local_48;
  }
  else {
    if ((pcVar2 == _addTable) &&
       ((import->super_Importable).base.super_IString.str._M_str == __Literal)) {
      std::operator<<((ostream *)&std::cout,"exit()\n");
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&ExitException::typeinfo,0);
    }
    this_00 = &getImportInstance(this,&import->super_Importable)->
               super_ModuleRunnerBase<wasm::ModuleRunner>;
    if (this_00 == (ModuleRunnerBase<wasm::ModuleRunner> *)0x0) {
      Fatal::Fatal((Fatal *)local_1f8);
      ppcVar1 = &argument.field_0.func.super_IString.str._M_str;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppcVar1,"callImport: unknown import: ",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppcVar1,(import->super_Importable).module.super_IString.str._M_str,
                 (import->super_Importable).module.super_IString.str._M_len);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppcVar1,".",1);
      Fatal::operator<<((Fatal *)local_1f8,
                        (basic_string_view<char,_std::char_traits<char>_> *)import);
      Fatal::~Fatal((Fatal *)local_1f8);
    }
    ModuleRunnerBase<wasm::ModuleRunner>::callExport
              (__return_storage_ptr__,this_00,
               (Name)(import->super_Importable).base.super_IString.str,local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
      for (auto argument : arguments) {
        std::cout << argument << " : " << argument.type << '\n';
      }
      return {};
    } else if (import->module == ENV && import->base == EXIT) {
      // XXX hack for torture tests
      std::cout << "exit()\n";
      throw ExitException();
    } else if (auto* inst = getImportInstance(import)) {
      return inst->callExport(import->base, arguments);
    }
    Fatal() << "callImport: unknown import: " << import->module.str << "."
            << import->name.str;
  }